

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetonationPdu.cpp
# Opt level: O0

bool __thiscall DIS::DetonationPdu::operator==(DetonationPdu *this,DetonationPdu *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  ulong local_28;
  size_t idx;
  bool ivarsEqual;
  DetonationPdu *rhs_local;
  DetonationPdu *this_local;
  
  idx._7_1_ = WarfareFamilyPdu::operator==
                        (&this->super_WarfareFamilyPdu,&rhs->super_WarfareFamilyPdu);
  bVar1 = EntityID::operator==(&this->_munitionID,&rhs->_munitionID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = EventID::operator==(&this->_eventID,&rhs->_eventID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = Vector3Float::operator==(&this->_velocity,&rhs->_velocity);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = Vector3Double::operator==
                    (&this->_locationInWorldCoordinates,&rhs->_locationInWorldCoordinates);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = BurstDescriptor::operator==(&this->_burstDescriptor,&rhs->_burstDescriptor);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = Vector3Float::operator==
                    (&this->_locationInEntityCoordinates,&rhs->_locationInEntityCoordinates);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_detonationResult != rhs->_detonationResult) {
    idx._7_1_ = false;
  }
  if (this->_pad != rhs->_pad) {
    idx._7_1_ = false;
  }
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::
            size(&this->_articulationParameters);
    if (sVar2 <= local_28) break;
    this_00 = std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::
              operator[](&this->_articulationParameters,local_28);
    rhs_00 = std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::
             operator[](&rhs->_articulationParameters,local_28);
    bVar1 = ArticulationParameter::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_28 = local_28 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool DetonationPdu::operator ==(const DetonationPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = WarfareFamilyPdu::operator==(rhs);

     if( ! (_munitionID == rhs._munitionID) ) ivarsEqual = false;
     if( ! (_eventID == rhs._eventID) ) ivarsEqual = false;
     if( ! (_velocity == rhs._velocity) ) ivarsEqual = false;
     if( ! (_locationInWorldCoordinates == rhs._locationInWorldCoordinates) ) ivarsEqual = false;
     if( ! (_burstDescriptor == rhs._burstDescriptor) ) ivarsEqual = false;
     if( ! (_locationInEntityCoordinates == rhs._locationInEntityCoordinates) ) ivarsEqual = false;
     if( ! (_detonationResult == rhs._detonationResult) ) ivarsEqual = false;
     if( ! (_pad == rhs._pad) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _articulationParameters.size(); idx++)
     {
        if( ! ( _articulationParameters[idx] == rhs._articulationParameters[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }